

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall
cmCTestMultiProcessHandler::CreateSerialTestCostList(cmCTestMultiProcessHandler *this)

{
  TestList *this_00;
  pointer piVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  pointer piVar4;
  pointer piVar5;
  int *piVar6;
  int test;
  int testDependency;
  TestList dependencies;
  TestList presortedList;
  TestSet alreadySortedTests;
  int local_b0;
  int local_ac;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  _Vector_base<int,_std::allocator<int>_> local_88;
  int *local_70;
  cmCTestMultiProcessHandler *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  for (p_Var3 = (this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 !=
      &(this->Tests).
       super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
       ._M_t._M_impl.super__Rb_tree_header; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_88,(value_type_conflict1 *)(p_Var3 + 1));
  }
  std::
  __stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<TestComparator>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_88._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_88._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<TestComparator>)this);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &this->SortedTests;
  local_70 = local_88._M_impl.super__Vector_impl_data._M_finish;
  piVar6 = local_88._M_impl.super__Vector_impl_data._M_finish;
  local_68 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (piVar4 = local_88._M_impl.super__Vector_impl_data._M_start; piVar4 != piVar6;
      piVar4 = piVar4 + 1) {
    local_b0 = *piVar4;
    bVar2 = ::cm::contains<cmCTestMultiProcessHandler::TestSet,_int,_0>
                      ((TestSet *)&local_60,&local_b0);
    if (!bVar2) {
      local_a8._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GetAllTestDependencies(this,local_b0,(TestList *)&local_a8);
      piVar1 = local_a8._M_impl.super__Vector_impl_data._M_finish;
      for (piVar5 = local_a8._M_impl.super__Vector_impl_data._M_start; piVar5 != piVar1;
          piVar5 = piVar5 + 1) {
        local_ac = *piVar5;
        bVar2 = ::cm::contains<cmCTestMultiProcessHandler::TestSet,_int,_0>
                          ((TestSet *)&local_60,&local_ac);
        if (!bVar2) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_60,&local_ac);
          std::vector<int,_std::allocator<int>_>::push_back
                    (&this_00->super_vector<int,_std::allocator<int>_>,&local_ac);
        }
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,&local_b0);
      std::vector<int,_std::allocator<int>_>::push_back
                (&this_00->super_vector<int,_std::allocator<int>_>,&local_b0);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
      this = local_68;
      piVar6 = local_70;
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CreateSerialTestCostList()
{
  TestList presortedList;

  for (auto const& i : this->Tests) {
    presortedList.push_back(i.first);
  }

  std::stable_sort(presortedList.begin(), presortedList.end(),
                   TestComparator(this));

  TestSet alreadySortedTests;

  for (int test : presortedList) {
    if (cm::contains(alreadySortedTests, test)) {
      continue;
    }

    TestList dependencies;
    this->GetAllTestDependencies(test, dependencies);

    for (int testDependency : dependencies) {
      if (!cm::contains(alreadySortedTests, testDependency)) {
        alreadySortedTests.insert(testDependency);
        this->SortedTests.push_back(testDependency);
      }
    }

    alreadySortedTests.insert(test);
    this->SortedTests.push_back(test);
  }
}